

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O3

void bit_array_merge(void *dest,void *source,size_t offset)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((source != (void *)0x0 && dest != (void *)0x0) && (uVar2 = *dest, offset < uVar2)) {
    uVar3 = 0;
    do {
      if (*source <= uVar3) {
        return;
      }
      if ((*(byte *)((long)source + (uVar3 >> 3) + 8) >> ((uint)uVar3 & 7) & 1) != 0) {
        pbVar1 = (byte *)((long)dest + (offset + uVar3 >> 3) + 8);
        *pbVar1 = *pbVar1 | '\x01' << ((char)offset + (char)uVar3 & 7U);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 - offset != uVar3);
  }
  return;
}

Assistant:

void bit_array_merge(void * dest, void * source, size_t offset)
{
	if (dest && source)
	{
		size_t * dsize = (size_t *) dest;
		size_t * ssize = (size_t *) source;
		size_t soffset = 0;
		while (offset < *dsize && soffset < *ssize)
		{
			if (bit_array_test(source, soffset))
			{
				bit_array_set(dest, offset);
			}
			soffset++;
			offset++;
		}
	}
}